

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_argument_buffer_aliased_descriptor
          (CompilerMSL *this,SPIRVariable *aliased_var,SPIRVariable *base_var)

{
  bool bVar1;
  uint32_t uVar2;
  Meta *pMVar3;
  ulong uVar4;
  char *pcVar5;
  SPIRType *pSVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char (*in_stack_fffffffffffffc38) [3];
  char (*in_stack_fffffffffffffc50) [3];
  byte local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator local_289;
  string local_288;
  string local_268;
  string local_248;
  char *local_228;
  string local_220;
  string local_200;
  string local_1e0;
  byte local_1b9;
  string local_1b8 [38];
  byte local_192;
  allocator local_191;
  undefined1 local_190 [8];
  string ref_type;
  undefined1 local_168 [6];
  bool needs_post_cast_deref;
  bool old_is_using_builtin_array;
  string local_148;
  string local_128;
  string local_108;
  allocator local_e1;
  undefined1 local_e0 [8];
  string descriptor_storage;
  SPIRType *data_type;
  SPIRType *var_type;
  string name;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68 [3];
  string local_50 [8];
  string unqualified_name;
  bool old_explicit_qualifier;
  Meta *var_meta;
  SPIRVariable *base_var_local;
  SPIRVariable *aliased_var_local;
  CompilerMSL *this_local;
  
  unqualified_name.field_2._12_4_ = (base_var->super_IVariant).self.id;
  pMVar3 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,
                               (ID)unqualified_name.field_2._12_4_);
  local_2b1 = 0;
  if (pMVar3 != (Meta *)0x0) {
    local_2b1 = (pMVar3->decoration).qualified_alias_explicit_override;
  }
  unqualified_name.field_2._M_local_buf[0xb] = local_2b1 & 1;
  if (pMVar3 != (Meta *)0x0) {
    (pMVar3->decoration).qualified_alias_explicit_override = false;
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(base_var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_50,this,(ulong)uVar2,0);
  if (pMVar3 != (Meta *)0x0) {
    (pMVar3->decoration).qualified_alias_explicit_override =
         (bool)(unqualified_name.field_2._M_local_buf[0xb] & 1);
  }
  uVar4 = ::std::__cxx11::string::size();
  if (((2 < uVar4) &&
      (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_50), *pcVar5 == '(')) &&
     (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_50), *pcVar5 == '*')) {
    local_70._M_current = (char *)::std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_68,&local_70);
    local_88._M_current = (char *)::std::__cxx11::string::begin();
    local_80 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_88,2);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_78,&local_80);
    name.field_2._8_8_ = ::std::__cxx11::string::erase(local_50,local_68[0],local_78);
    ::std::__cxx11::string::pop_back();
  }
  ::std::__cxx11::string::string((string *)&var_type);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(aliased_var->super_IVariant).field_0xc);
  pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  descriptor_storage.field_2._8_8_ = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self);
  pcVar5 = descriptor_address_space(this,uVar2,aliased_var->storage,"");
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_e0,pcVar5,&local_e1);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (aliased_var->storage == StorageClassUniformConstant) {
    bVar1 = is_var_runtime_size_array(this,aliased_var);
    if (bVar1) {
      pSVar6 = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self)
      ;
      type_to_glsl_abi_cxx11_(&local_128,this,pSVar6,uVar2,true);
      join<char_const(&)[18],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&local_108,(spirv_cross *)0x4ae1f0,(char (*) [18])local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
                 (char (*) [2])&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a3eae,
                 (char (*) [4])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                 (char (*) [2])in_stack_fffffffffffffc38);
      ::std::__cxx11::string::operator=((string *)&var_type,(string *)&local_108);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      pSVar6 = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self)
      ;
      type_to_glsl_abi_cxx11_((string *)local_168,this,pSVar6,uVar2,true);
      join<char_const(&)[18],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[3]>
                (&local_148,(spirv_cross *)0x4ae1f0,(char (*) [18])local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
                 (char (*) [2])local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" &>(",
                 (char (*) [5])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4af37b,
                 in_stack_fffffffffffffc38);
      ::std::__cxx11::string::operator=((string *)&var_type,(string *)&local_148);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::__cxx11::string::~string((string *)local_168);
    }
  }
  else {
    ref_type.field_2._M_local_buf[0xf] = this->is_using_builtin_array & 1;
    this->is_using_builtin_array = true;
    bVar1 = Compiler::is_array((Compiler *)this,(SPIRType *)descriptor_storage.field_2._8_8_);
    ref_type.field_2._M_local_buf[0xe] = (bVar1 ^ 0xffU) & 1;
    local_192 = 0;
    local_1b9 = 0;
    if (ref_type.field_2._M_local_buf[0xe] == 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self)
      ;
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar2;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(local_1b8,this,pSVar6);
      local_1b9 = 1;
      join<char_const(&)[4],std::__cxx11::string>
                ((string *)local_190,(spirv_cross *)0x4966ab,(char (*) [4])local_1b8,ts_1);
    }
    else {
      ::std::allocator<char>::allocator();
      local_192 = 1;
      ::std::__cxx11::string::string((string *)local_190,"&",&local_191);
    }
    if ((local_1b9 & 1) != 0) {
      ::std::__cxx11::string::~string(local_1b8);
    }
    if ((local_192 & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    bVar1 = is_var_runtime_size_array(this,aliased_var);
    if (bVar1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self)
      ;
      type_to_glsl_abi_cxx11_(&local_200,this,pSVar6,uVar2,true);
      join<char_const(&)[18],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2]>
                (&local_1e0,(spirv_cross *)0x4ae1f0,(char (*) [18])&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
                 (char (*) [2])local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" *>(&",
                 (char (*) [6])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                 (char (*) [2])in_stack_fffffffffffffc38);
      ::std::__cxx11::string::operator=((string *)&var_type,(string *)&local_1e0);
      ::std::__cxx11::string::~string((string *)&local_1e0);
      ::std::__cxx11::string::~string((string *)&local_200);
    }
    else {
      local_228 = "";
      if ((ref_type.field_2._M_local_buf[0xe] & 1U) != 0) {
        local_228 = "*";
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self)
      ;
      type_to_glsl_abi_cxx11_(&local_248,this,pSVar6,uVar2,true);
      join<char_const*,char_const(&)[18],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (&local_220,(spirv_cross *)&local_228,(char **)0x4ae1f0,(char (*) [18])&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
                 (char (*) [2])local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
                 (char (*) [2])local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a3ea9,
                 (char (*) [3])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4af37b,
                 in_stack_fffffffffffffc50);
      ::std::__cxx11::string::operator=((string *)&var_type,(string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_248);
    }
    if ((ref_type.field_2._M_local_buf[0xe] & 1U) != 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self)
      ;
      get_type_address_space_abi_cxx11_(&local_268,this,pSVar6,uVar2,false);
      ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_268);
      ::std::__cxx11::string::~string((string *)&local_268);
    }
    if ((this->suppress_incompatible_pointer_types_discard_qualifiers & 1U) == 0) {
      this->suppress_incompatible_pointer_types_discard_qualifiers = true;
      Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
    }
    this->is_using_builtin_array = (bool)(ref_type.field_2._M_local_buf[0xf] & 1);
    ::std::__cxx11::string::~string((string *)local_190);
  }
  bVar1 = is_var_runtime_size_array(this,aliased_var);
  if (bVar1) {
    pmVar7 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                          &(aliased_var->super_IVariant).self);
    bVar1 = ::std::operator!=(&(pmVar7->decoration).qualified_alias,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &var_type);
    if (bVar1) {
      Compiler::force_recompile((Compiler *)this);
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self);
    Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)&var_type);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_288,"",&local_289);
    Compiler::set_qualified_name((Compiler *)this,uVar2,&local_288);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_289);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(aliased_var->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_2b0,this,(ulong)uVar2,1);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               (char (*) [8])" auto &",&local_2b0,(char (*) [4])0x4a41f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var_type);
    ::std::__cxx11::string::~string((string *)&local_2b0);
  }
  ::std::__cxx11::string::~string((string *)local_e0);
  ::std::__cxx11::string::~string((string *)&var_type);
  ::std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void CompilerMSL::emit_argument_buffer_aliased_descriptor(const SPIRVariable &aliased_var,
                                                          const SPIRVariable &base_var)
{
	// To deal with buffer <-> image aliasing, we need to perform an unholy UB ritual.
	// A texture type in Metal 3.0 is a pointer. However, we cannot simply cast a pointer to texture.
	// What we *can* do is to cast pointer-to-pointer to pointer-to-texture.

	// We need to explicitly reach into the descriptor buffer lvalue, not any spvDescriptorArray wrapper.
	auto *var_meta = ir.find_meta(base_var.self);
	bool old_explicit_qualifier = var_meta && var_meta->decoration.qualified_alias_explicit_override;
	if (var_meta)
		var_meta->decoration.qualified_alias_explicit_override = false;
	auto unqualified_name = to_name(base_var.self, false);
	if (var_meta)
		var_meta->decoration.qualified_alias_explicit_override = old_explicit_qualifier;

	// For non-arrayed buffers, we have already performed a de-reference.
	// We need a proper lvalue to cast, so strip away the de-reference.
	if (unqualified_name.size() > 2 && unqualified_name[0] == '(' && unqualified_name[1] == '*')
	{
		unqualified_name.erase(unqualified_name.begin(), unqualified_name.begin() + 2);
		unqualified_name.pop_back();
	}

	string name;

	auto &var_type = get<SPIRType>(aliased_var.basetype);
	auto &data_type = get_variable_data_type(aliased_var);
	string descriptor_storage = descriptor_address_space(aliased_var.self, aliased_var.storage, "");

	if (aliased_var.storage == StorageClassUniformConstant)
	{
		if (is_var_runtime_size_array(aliased_var))
		{
			// This becomes a plain pointer to spvDescriptor.
			name = join("reinterpret_cast<", descriptor_storage, " ",
			            type_to_glsl(get_variable_data_type(aliased_var), aliased_var.self, true), ">(&",
			            unqualified_name, ")");
		}
		else
		{
			name = join("reinterpret_cast<", descriptor_storage, " ",
			            type_to_glsl(get_variable_data_type(aliased_var), aliased_var.self, true), " &>(",
			            unqualified_name, ");");
		}
	}
	else
	{
		// Buffer types.
		bool old_is_using_builtin_array = is_using_builtin_array;
		is_using_builtin_array = true;

		bool needs_post_cast_deref = !is_array(data_type);
		string ref_type = needs_post_cast_deref ? "&" : join("(&)", type_to_array_glsl(var_type, aliased_var.self));

		if (is_var_runtime_size_array(aliased_var))
		{
			name = join("reinterpret_cast<",
			            type_to_glsl(var_type, aliased_var.self, true), " ", descriptor_storage, " *>(&",
			            unqualified_name, ")");
		}
		else
		{
			name = join(needs_post_cast_deref ? "*" : "", "reinterpret_cast<",
			            type_to_glsl(var_type, aliased_var.self, true), " ", descriptor_storage, " ",
			            ref_type,
			            ">(", unqualified_name, ");");
		}

		if (needs_post_cast_deref)
			descriptor_storage = get_type_address_space(var_type, aliased_var.self, false);

		// These kinds of ridiculous casts trigger warnings in compiler. Just ignore them.
		if (!suppress_incompatible_pointer_types_discard_qualifiers)
		{
			suppress_incompatible_pointer_types_discard_qualifiers = true;
			force_recompile_guarantee_forward_progress();
		}

		is_using_builtin_array = old_is_using_builtin_array;
	}

	if (!is_var_runtime_size_array(aliased_var))
	{
		// Lower to temporary, so drop the qualification.
		set_qualified_name(aliased_var.self, "");
		statement(descriptor_storage, " auto &", to_name(aliased_var.self), " = ", name);
	}
	else
	{
		// This alias may have already been used to emit an entry point declaration. If there is a mismatch, we need a recompile.
		// Moving this code to be run earlier will also conflict,
		// because we need the qualified alias for the base resource,
		// so forcing recompile until things sync up is the least invasive method for now.
		if (ir.meta[aliased_var.self].decoration.qualified_alias != name)
			force_recompile();

		// This will get wrapped in a separate temporary when a spvDescriptorArray wrapper is emitted.
		set_qualified_name(aliased_var.self, name);
	}
}